

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracer.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> * __thiscall
PathTracer::ExtractColorImage
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,PathTracer *this,
          shared_ptr<myvk::CommandPool> *command_pool)

{
  void *pvVar1;
  pointer pfVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  uint uVar5;
  undefined4 *puVar6;
  shared_ptr<myvk::Buffer> staging_buffer;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> local_58;
  __shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  uVar5 = this->m_height * this->m_width;
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_58.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)&staging_buffer,(Ptr<Device> *)CONCAT44(extraout_var,iVar3),
             (ulong)(uVar5 * 4) << 2,0x804,2,VMA_MEMORY_USAGE_AUTO,&local_58);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            (&local_58);
  std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
            ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             &(this->m_color_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            (local_38,&staging_buffer.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  extract_target_image_to_buffer
            (command_pool,(shared_ptr<myvk::ImageBase> *)&local_58,
             (shared_ptr<myvk::BufferBase> *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_58.
              super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  pvVar1 = (staging_buffer.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_mapped_ptr;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(ulong)(uVar5 * 3),(allocator_type *)&local_58);
  pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = (undefined4 *)((long)pvVar1 + 8);
  for (lVar4 = 0; (ulong)uVar5 * 0xc - lVar4 != 0; lVar4 = lVar4 + 0xc) {
    *(undefined4 *)((long)pfVar2 + lVar4) = puVar6[-2];
    *(undefined4 *)((long)pfVar2 + lVar4 + 4) = puVar6[-1];
    *(undefined4 *)((long)pfVar2 + lVar4 + 8) = *puVar6;
    puVar6 = puVar6 + 4;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&staging_buffer.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> PathTracer::ExtractColorImage(const std::shared_ptr<myvk::CommandPool> &command_pool) const {
	const uint32_t kSize = m_width * m_height;
	std::shared_ptr<myvk::Buffer> staging_buffer =
	    myvk::Buffer::Create(command_pool->GetDevicePtr(), kSize * 4 * sizeof(float),
	                         VMA_ALLOCATION_CREATE_MAPPED_BIT | VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT,
	                         VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	extract_target_image_to_buffer(command_pool, m_color_image, staging_buffer);

	auto *data = (float *)staging_buffer->GetMappedData();
	std::vector<float> pixels(kSize * 3);
	for (int i = 0; i < kSize; ++i) {
		pixels[i * 3 + 0] = data[i * 4 + 0];
		pixels[i * 3 + 1] = data[i * 4 + 1];
		pixels[i * 3 + 2] = data[i * 4 + 2];
	}

	return pixels;
}